

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListViewPrivate::QListViewPrivate(QListViewPrivate *this)

{
  undefined8 *in_RDI;
  QAbstractItemViewPrivate *in_stack_fffffffffffffff0;
  
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(in_stack_fffffffffffffff0);
  *in_RDI = &PTR__QListViewPrivate_00d2eb58;
  in_RDI[0xa8] = 0;
  *(undefined1 *)(in_RDI + 0xa9) = 0;
  *(undefined4 *)((long)in_RDI + 0x54c) = 0;
  QSize::QSize((QSize *)in_stack_fffffffffffffff0);
  *(undefined4 *)(in_RDI + 0xab) = 1;
  *(undefined4 *)((long)in_RDI + 0x55c) = 0;
  *(undefined4 *)(in_RDI + 0xac) = 0;
  *(undefined4 *)((long)in_RDI + 0x564) = 0;
  *(undefined4 *)(in_RDI + 0xad) = 0;
  *(undefined1 *)((long)in_RDI + 0x56c) = 0;
  QRect::QRect((QRect *)in_stack_fffffffffffffff0);
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 0xb0));
  QSet<QPersistentModelIndex>::QSet((QSet<QPersistentModelIndex> *)0x87f98e);
  *(undefined4 *)(in_RDI + 0xb2) = 0;
  *(undefined1 *)((long)in_RDI + 0x594) = 0;
  QSize::QSize((QSize *)in_stack_fffffffffffffff0);
  *(undefined4 *)(in_RDI + 0xb4) = 100;
  QRect::QRect((QRect *)in_stack_fffffffffffffff0);
  *(undefined1 *)((long)in_RDI + 0x5b4) = 0;
  memset(in_RDI + 0xb7,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x87f9f6);
  return;
}

Assistant:

QListViewPrivate::QListViewPrivate()
    : QAbstractItemViewPrivate(),
      commonListView(nullptr),
      wrap(false),
      space(0),
      flow(QListView::TopToBottom),
      movement(QListView::Static),
      resizeMode(QListView::Fixed),
      layoutMode(QListView::SinglePass),
      viewMode(QListView::ListMode),
      modeProperties(0),
      column(0),
      uniformItemSizes(false),
      batchSize(100),
      showElasticBand(false),
      itemAlignment(Qt::Alignment())
{
}